

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

string * leveldb::LockFileName(string *__return_storage_ptr__,string *dbname)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::operator+(__return_storage_ptr__,dbname,"/LOCK");
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string LockFileName(const std::string& dbname) { return dbname + "/LOCK"; }